

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism.cc
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_74545::VertexToVertexMappingHash::operator()
          (VertexToVertexMappingHash *this,VertexToVertexMapping *v)

{
  bool bVar1;
  const_iterator seed;
  reference v_00;
  type *t;
  type *p;
  const_iterator __end2;
  const_iterator __begin2;
  VertexToVertexMapping *__range2;
  size_t result;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *in_stack_ffffffffffffffc0;
  _Self local_28 [2];
  size_t local_18;
  
  local_18 = 0;
  local_28[0]._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (in_stack_ffffffffffffffb8);
  seed = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator==(local_28,(_Self *)&stack0xffffffffffffffd0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    v_00 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*
                     (in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 =
         (_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)
         std::get<0ul,int_const,int>((pair<const_int,_int> *)0x1425ef);
    std::get<1ul,int_const,int>((pair<const_int,_int> *)0x1425fe);
    boost::hash_combine<int>((size_t *)seed._M_node,&v_00->first);
    boost::hash_combine<int>((size_t *)seed._M_node,&v_00->first);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(in_stack_ffffffffffffffc0);
  }
  return local_18;
}

Assistant:

auto operator()(const VertexToVertexMapping & v) const -> size_t
        {
            size_t result{0};
            for (auto & [p, t] : v) {
                hash_combine(result, p);
                hash_combine(result, t);
            }
            return result;
        }